

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_info.c
# Opt level: O2

void duckdb_je_bin_info_boot(sc_data_t *sc_data,uint *bin_shard_sizes)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  szind_t sVar9;
  long lVar10;
  size_t *psVar11;
  
  sVar3 = duckdb_je_opt_bin_info_max_batched_size;
  psVar11 = &duckdb_je_bin_infos[0].bitmap_info.ngroups;
  piVar7 = &sc_data->sc[0].pgs;
  sVar9 = duckdb_je_bin_info_nbatched_sizes;
  uVar5 = duckdb_je_bin_info_nbatched_bins;
  uVar6 = duckdb_je_bin_info_nunbatched_bins;
  for (lVar10 = 0; lVar10 != 0x24; lVar10 = lVar10 + 1) {
    uVar8 = ((long)piVar7[-2] << ((byte)piVar7[-3] & 0x3f)) + (1L << ((byte)piVar7[-4] & 0x3f));
    psVar11[-4] = uVar8;
    iVar4 = *piVar7;
    psVar11[-3] = (long)(iVar4 << 0xc);
    uVar2 = (ulong)(long)(iVar4 << 0xc) / uVar8;
    iVar4 = (int)uVar2;
    *(int *)(psVar11 + -2) = iVar4;
    uVar1 = bin_shard_sizes[lVar10];
    *(uint *)((long)psVar11 + -0xc) = uVar1;
    ((bitmap_info_t *)(psVar11 + -1))->nbits = uVar2 & 0xffffffff;
    *psVar11 = (ulong)(iVar4 + 0x3fU >> 6);
    if (sVar3 < uVar8) {
      uVar6 = uVar6 + uVar1;
      duckdb_je_bin_info_nunbatched_bins = uVar6;
    }
    else {
      sVar9 = sVar9 + 1;
      uVar5 = uVar5 + uVar1;
      duckdb_je_bin_info_nbatched_sizes = sVar9;
      duckdb_je_bin_info_nbatched_bins = uVar5;
    }
    piVar7 = piVar7 + 7;
    psVar11 = psVar11 + 5;
  }
  return;
}

Assistant:

void
bin_info_boot(sc_data_t *sc_data, unsigned bin_shard_sizes[SC_NBINS]) {
	assert(sc_data->initialized);
	bin_infos_init(sc_data, bin_shard_sizes, bin_infos);
}